

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O1

void __thiscall
Am_Inter_Location_Data::Am_Inter_Location_Data
          (Am_Inter_Location_Data *this,bool line,Am_Object *ref,int a,int b,int c,int d,bool grow,
          bool direct)

{
  (this->super_Am_Wrapper).refs = 1;
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_002e33e8;
  (this->ref_obj).data = (Am_Object_Data *)0x0;
  this->as_line = line;
  this->directional = direct;
  Am_Object::operator=(&this->ref_obj,ref);
  this->growing = grow;
  (this->data).rect.left = a;
  (this->data).rect.top = b;
  (this->data).rect.width = c;
  (this->data).rect.height = d;
  this->a_control = Am_LOCATION_OK;
  this->b_control = Am_LOCATION_OK;
  this->c_control = Am_LOCATION_OK;
  this->d_control = Am_LOCATION_OK;
  return;
}

Assistant:

Am_Inter_Location_Data::Am_Inter_Location_Data(bool line, Am_Object ref, int a,
                                               int b, int c, int d, bool grow,
                                               bool direct)
{
  as_line = line;
  directional = direct;
  ref_obj = ref;
  growing = grow;
  data.line.x1 = a;
  data.line.y1 = b;
  data.line.x2 = c;
  data.line.y2 = d;
  a_control = Am_LOCATION_OK;
  b_control = Am_LOCATION_OK;
  c_control = Am_LOCATION_OK;
  d_control = Am_LOCATION_OK;
}